

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool __thiscall TestBranchInternal2::Run(TestBranchInternal2 *this)

{
  Outputter *pOVar1;
  bool bVar2;
  stack<testinator::Branch_*,_std::deque<testinator::Branch_*,_std::allocator<testinator::Branch_*>_>_>
  *this_00;
  reference ppBVar3;
  string *b;
  char (*s) [8];
  undefined1 local_89 [9];
  Cons<std::pair<testinator::Nil,_const_char_*>_> *local_80;
  Cons<std::pair<std::pair<testinator::Nil,_const_char_*>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
  local_78;
  testinator local_60 [54];
  anon_class_1_0_00000001_for_m_f local_2a;
  testinator local_29;
  undefined1 local_28 [7];
  AtScopeExit<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_elbeno[P]testinator_src_test_main_cpp:448:5)>
  rspop448;
  BranchScope rs448;
  TestBranchInternal2 *this_local;
  
  testinator::BranchScope::BranchScope
            ((BranchScope *)local_28,0x1c0,
             "/workspace/llm4binary/github/license_c_cmakelists/elbeno[P]testinator/src/test/main.cpp"
             ,"");
  bVar2 = testinator::BranchScope::canRun((BranchScope *)local_28);
  if (bVar2) {
    testinator::at_scope_exit<TestBranchInternal2::Run()::_lambda()_1_>(&local_29,&local_2a);
    bVar2 = testinator::AtScopeExit::operator_cast_to_bool((AtScopeExit *)&local_29);
    if (bVar2) {
      pOVar1 = (this->super_Test).m_op;
      local_89[0] = 0;
      local_80 = testinator::operator<<
                           ((Cons<std::pair<testinator::Nil,_const_char_*>_> *)local_89,
                            (Cons<testinator::Nil> *)"branch ",s);
      this_00 = testinator::Branch::getStack();
      ppBVar3 = std::
                stack<testinator::Branch_*,_std::deque<testinator::Branch_*,_std::allocator<testinator::Branch_*>_>_>
                ::top(this_00);
      b = testinator::Branch::getName_abi_cxx11_(*ppBVar3);
      testinator::operator<<
                (&local_78,(Cons<std::pair<testinator::Nil,_const_char_*>_> *)(local_89 + 1),b);
      testinator::
      Diagnostic<testinator::Cons<std::pair<std::pair<testinator::Nil,char_const*>,std::__cxx11::string_const&>>>
                (local_60,&local_78);
      (*pOVar1->_vptr_Outputter[3])(pOVar1,local_60);
      std::__cxx11::string::~string((string *)local_60);
    }
    testinator::
    AtScopeExit<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/elbeno[P]testinator/src/test/main.cpp:448:5)>
    ::~AtScopeExit((AtScopeExit<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_elbeno[P]testinator_src_test_main_cpp:448:5)>
                    *)&local_29);
  }
  testinator::BranchScope::~BranchScope((BranchScope *)local_28);
  return true;
}

Assistant:

virtual bool Run()
  {
    BRANCH()
    {
      DIAGNOSTIC("branch " << BRANCH_NAME);
    }

    return true;
  }